

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

size_t perfetto::base::Find(StringView *needle,StringView *haystack)

{
  ulong __n;
  char *pcVar1;
  char *__s2;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  __n = needle->size_;
  if (__n == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0xffffffffffffffff;
    lVar5 = haystack->size_ - __n;
    if ((__n <= haystack->size_) && (lVar5 != -1)) {
      pcVar1 = haystack->data_;
      __s2 = needle->data_;
      sVar4 = 0;
      do {
        iVar2 = strncmp(pcVar1 + sVar4,__s2,__n);
        if (iVar2 == 0) {
          return sVar4;
        }
        sVar4 = sVar4 + 1;
      } while (lVar5 + 1U != sVar4);
    }
  }
  return sVar3;
}

Assistant:

size_t size() const { return size_; }